

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

uint8_t pack_first_byte(int indexing_mode)

{
  int in_EDI;
  uint8_t local_1;
  
  if (in_EDI == 0) {
    local_1 = '@';
  }
  else if (in_EDI == 1) {
    local_1 = '\0';
  }
  else {
    if (in_EDI != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_hd.c"
                    ,0x403,"uint8_t pack_first_byte(int)");
    }
    local_1 = '\x10';
  }
  return local_1;
}

Assistant:

static uint8_t pack_first_byte(int indexing_mode) {
  switch (indexing_mode) {
  case NGHTTP2_HD_WITH_INDEXING:
    return 0x40u;
  case NGHTTP2_HD_WITHOUT_INDEXING:
    return 0;
  case NGHTTP2_HD_NEVER_INDEXING:
    return 0x10u;
  default:
    assert(0);
  }
  /* This is required to compile with android NDK r10d +
     --enable-werror */
  return 0;
}